

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O1

char * item2str(Item *q,char *cp)

{
  short sVar1;
  size_t sVar2;
  Symbol *q_00;
  
  sVar1 = q->itemtype;
  q_00 = (q->element).sym;
  if (sVar1 == 0x102) {
    strcpy(cp,(char *)q_00);
  }
  else if (sVar1 == 2) {
    item2str((Item *)q_00,cp);
  }
  else {
    if (sVar1 == 1) {
      q_00 = (Symbol *)q_00->name;
    }
    sprintf(cp," %s",q_00);
  }
  sVar2 = strlen(cp);
  return cp + sVar2;
}

Assistant:

char* item2str(Item* q, char* cp) {
  if (q->itemtype == SYMBOL) {
    sprintf(cp, " %s", SYM(q)->name);
  } else if (q->itemtype == VERBATIM) {
    sprintf(cp, "%s", STR(q));
  } else if (q->itemtype == ITEM) {
    item2str(ITM(q), cp);
  }else {
    sprintf(cp, " %s", STR(q));
  }
  return cp + strlen(cp);
}